

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

string * __thiscall picojson::value::to_str_abi_cxx11_(string *__return_storage_ptr__,value *this)

{
  bool bVar1;
  double dVar2;
  double *__end;
  int iVar3;
  lconv *plVar4;
  runtime_error *this_00;
  char *pcVar5;
  allocator local_19c;
  allocator local_19b;
  allocator local_19a;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  double *local_158;
  char *p;
  size_t decimal_point_len;
  char *decimal_point;
  double tmp;
  char buf [256];
  allocator local_2d [20];
  allocator local_19;
  value *local_18;
  value *this_local;
  
  local_18 = this;
  this_local = (value *)__return_storage_ptr__;
  switch(this->type_) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 1:
    pcVar5 = "false";
    if (((this->u_).boolean_ & 1U) != 0) {
      pcVar5 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 2:
    bVar1 = false;
    if (ABS((this->u_).number_) < 9007199254740992.0) {
      dVar2 = modf((this->u_).number_,(double *)&decimal_point);
      bVar1 = dVar2 == 0.0;
    }
    pcVar5 = "%.17g";
    if (bVar1) {
      pcVar5 = "%.f";
    }
    snprintf((char *)&tmp,0x100,pcVar5,SUB84(this->u_,0));
    plVar4 = localeconv();
    decimal_point_len = (size_t)plVar4->decimal_point;
    iVar3 = strcmp((char *)decimal_point_len,".");
    if (iVar3 != 0) {
      p = (char *)strlen((char *)decimal_point_len);
      for (local_158 = &tmp; *(char *)local_158 != '\0'; local_158 = (double *)((long)local_158 + 1)
          ) {
        iVar3 = strncmp((char *)local_158,(char *)decimal_point_len,(size_t)p);
        __end = local_158;
        if (iVar3 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char*,void>
                    ((string *)&local_198,(char *)&tmp,(char *)__end,&local_199);
          std::operator+(&local_178,&local_198,".");
          std::operator+(__return_storage_ptr__,&local_178,(char *)((long)local_158 + (long)p));
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
          return __return_storage_ptr__;
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&tmp,&local_19a);
    std::allocator<char>::~allocator((allocator<char> *)&local_19a);
    break;
  case 3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->u_).string_);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"array",&local_19b);
    std::allocator<char>::~allocator((allocator<char> *)&local_19b);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"object",&local_19c);
    std::allocator<char>::~allocator((allocator<char> *)&local_19c);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"0");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string value::to_str() const {
    switch (type_) {
    case null_type:      return "null";
    case boolean_type:   return u_.boolean_ ? "true" : "false";
#ifdef PICOJSON_USE_INT64
    case int64_type: {
      char buf[sizeof("-9223372036854775808")];
      SNPRINTF(buf, sizeof(buf), "%" PRId64, u_.int64_);
      return buf;
    }
#endif
    case number_type:    {
      char buf[256];
      double tmp;
      SNPRINTF(buf, sizeof(buf), fabs(u_.number_) < (1ULL << 53) && modf(u_.number_, &tmp) == 0 ? "%.f" : "%.17g", u_.number_);
#if PICOJSON_USE_LOCALE
      char *decimal_point = localeconv()->decimal_point;
      if (strcmp(decimal_point, ".") != 0) {
        size_t decimal_point_len = strlen(decimal_point);
        for (char *p = buf; *p != '\0'; ++p) {
          if (strncmp(p, decimal_point, decimal_point_len) == 0) {
            return std::string(buf, p) + "." + (p + decimal_point_len);
          }
        }
      }
#endif
      return buf;
    }
    case string_type:    return *u_.string_;
    case array_type:     return "array";
    case object_type:    return "object";
    default:             PICOJSON_ASSERT(0);
#ifdef _MSC_VER
      __assume(0);
#endif
    }
    return std::string();
  }